

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Joytime::Controller::readSPIFlash
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Controller *this,int32_t address,uint8_t length)

{
  long lVar1;
  initializer_list<unsigned_char> __l;
  allocator_type local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> res;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (undefined1)address;
  res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = (undefined1)((uint)address >> 8);
  res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = (undefined1)((uint)address >> 0x10);
  res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._3_1_ = (undefined1)((uint)address >> 0x18);
  res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._4_1_ = length;
  __l._M_len = 5;
  __l._M_array = (iterator)&res;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&buf,__l,&local_61);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&buf);
  sendSubcommand(&res,this,RumbleAndSubcommand,ReadSPIFlash,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  lVar1 = CONCAT44(res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   CONCAT13(res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._3_1_,
                            CONCAT12(res.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                     CONCAT11(res.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                              res.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_1_))));
  if ((ulong)((long)res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - lVar1) < 0x14) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (uchar *)(lVar1 + 0x14),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_61);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Joytime::Controller::readSPIFlash(int32_t address, uint8_t length) {
  std::vector<uint8_t> buf = {
    (uint8_t)((address) & 0xff),
    (uint8_t)((address >> 8) & 0xff),
    (uint8_t)((address >> 16) & 0xff),
    (uint8_t)((address >> 24) & 0xff),
    length
  };

  std::vector<uint8_t> res = sendSubcommand(Joytime::ControllerCommand::RumbleAndSubcommand, Joytime::ControllerSubcommand::ReadSPIFlash, buf);
  if (res.size() < 20) return std::vector<uint8_t>();

  // offset 20, explained:
  // 15 - subcommand response data starts at 15
  // 4  - 4 bytes for the address read
  // 1  - 1 byte for length
  return std::vector<uint8_t>(res.begin() + 20, res.end());
}